

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O3

UBool __thiscall icu_63::TextTrieMap::growNodes(TextTrieMap *this)

{
  int iVar1;
  CharacterNode *__src;
  CharacterNode *__dest;
  int iVar2;
  
  iVar1 = this->fNodesCapacity;
  if (iVar1 != 0xffff) {
    iVar2 = 0xfc17;
    if (iVar1 < 0xfc17) {
      iVar2 = iVar1;
    }
    __dest = (CharacterNode *)uprv_malloc_63((long)iVar2 * 0x10 + 16000);
    if (__dest != (CharacterNode *)0x0) {
      __src = this->fNodes;
      memcpy(__dest,__src,(long)this->fNodesCount << 4);
      uprv_free_63(__src);
      this->fNodes = __dest;
      this->fNodesCapacity = iVar2 + 1000;
    }
    return __dest != (CharacterNode *)0x0;
  }
  return '\0';
}

Assistant:

UBool
TextTrieMap::growNodes() {
    if (fNodesCapacity == 0xffff) {
        return FALSE;  // We use 16-bit node indexes.
    }
    int32_t newCapacity = fNodesCapacity + 1000;
    if (newCapacity > 0xffff) {
        newCapacity = 0xffff;
    }
    CharacterNode *newNodes = (CharacterNode *)uprv_malloc(newCapacity * sizeof(CharacterNode));
    if (newNodes == NULL) {
        return FALSE;
    }
    uprv_memcpy(newNodes, fNodes, fNodesCount * sizeof(CharacterNode));
    uprv_free(fNodes);
    fNodes = newNodes;
    fNodesCapacity = newCapacity;
    return TRUE;
}